

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char * hts_parse_reg(char *s,int *beg,int *end)

{
  long lVar1;
  char cVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ushort **ppuVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  undefined8 uStack_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  char *local_40;
  char *tmp;
  
  *end = -1;
  *beg = -1;
  uStack_60 = 0x10cdd0;
  sVar7 = strlen(s);
  uVar8 = sVar7 & 0xffffffff;
  iVar14 = (int)sVar7;
  uVar15 = (long)(iVar14 + -1) + 1;
  do {
    uVar8 = uVar8 - 1;
    if ((int)uVar15 < 1) goto LAB_0010cf15;
    uVar15 = uVar15 - 1;
  } while (s[uVar8 & 0xffffffff] != ':');
  if ((int)uVar15 < iVar14) {
    local_50 = beg;
    local_58 = end;
    local_48 = sVar7;
    tmp._4_4_ = 0;
    uVar8 = uVar15;
    do {
      uVar5 = uVar8 + 1;
LAB_0010ce1e:
      uVar8 = uVar5;
      if ((long)iVar14 <= (long)uVar8) goto LAB_0010ce56;
      cVar2 = s[uVar8];
      if ((long)cVar2 != 0x2d) goto code_r0x0010ce31;
      tmp._4_4_ = tmp._4_4_ + 1;
    } while( true );
  }
LAB_0010ce71:
  iVar14 = (int)uVar15;
  iVar16 = (int)sVar7;
  if (iVar14 < iVar16) {
    lVar11 = -((long)((iVar16 - iVar14) + 1) + 0xfU & 0xfffffffffffffff0);
    pcVar13 = (char *)((long)&local_58 + lVar11);
    local_40 = pcVar13;
    lVar10 = (long)iVar14;
    uVar12 = 0;
    while( true ) {
      lVar1 = lVar10 + 1;
      if (iVar16 <= lVar1) break;
      lVar4 = lVar10 + 1;
      lVar10 = lVar1;
      if (s[lVar4] != ',') {
        pcVar13[uVar12] = s[lVar4];
        uVar12 = uVar12 + 1;
      }
    }
    pcVar13[uVar12] = '\0';
    *(undefined8 *)((long)&uStack_60 + lVar11) = 10;
    uVar3 = *(undefined8 *)((long)&uStack_60 + lVar11);
    *(undefined8 *)((long)&uStack_60 + lVar11) = 0x10ced5;
    lVar10 = strtol(pcVar13,&local_40,(int)uVar3);
    iVar6 = (int)lVar10 + -1;
    iVar14 = 0;
    if (0 < iVar6) {
      iVar14 = iVar6;
    }
    *beg = iVar14;
    if (*local_40 == '\0') {
      iVar14 = 0x7fffffff;
    }
    else {
      pcVar13 = local_40 + 1;
      *(undefined8 *)((long)&uStack_60 + lVar11) = 10;
      uVar3 = *(undefined8 *)((long)&uStack_60 + lVar11);
      *(undefined8 *)((long)&uStack_60 + lVar11) = 0x10cefc;
      lVar11 = strtol(pcVar13,&local_40,(int)uVar3);
      iVar14 = (int)lVar11;
    }
    *end = iVar14;
    uVar15 = uVar15 & 0xffffffff;
    if (iVar14 < *beg) {
      uVar15 = sVar7 & 0xffffffff;
    }
  }
  iVar14 = (int)uVar15;
  sVar7 = uVar15 & 0xffffffff;
  if (iVar14 == iVar16) {
LAB_0010cf15:
    *beg = 0;
    *end = 0x7fffffff;
    iVar14 = (int)sVar7;
  }
  return s + iVar14;
code_r0x0010ce31:
  uStack_60 = 0x10ce36;
  ppuVar9 = __ctype_b_loc();
  uVar5 = uVar8 + 1;
  if ((cVar2 != ',') && (((*ppuVar9)[cVar2] & 0x800) == 0)) {
LAB_0010ce56:
    if (1 < tmp._4_4_) {
      uVar15 = local_48;
    }
    if ((long)uVar8 < (long)iVar14) {
      uVar15 = local_48;
    }
    uVar15 = uVar15 & 0xffffffff;
    sVar7 = local_48;
    end = local_58;
    beg = local_50;
    goto LAB_0010ce71;
  }
  goto LAB_0010ce1e;
}

Assistant:

const char *hts_parse_reg(const char *s, int *beg, int *end)
{
    int i, k, l, name_end;
    *beg = *end = -1;
    name_end = l = strlen(s);
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
    }
    // parse the interval
    if (name_end < l) {
        char *tmp;
        tmp = (char*)alloca(l - name_end + 1);
        for (i = name_end + 1, k = 0; i < l; ++i)
            if (s[i] != ',') tmp[k++] = s[i];
        tmp[k] = 0;
        if ((*beg = strtol(tmp, &tmp, 10) - 1) < 0) *beg = 0;
        *end = *tmp? strtol(tmp + 1, &tmp, 10) : INT_MAX;
        if (*beg > *end) name_end = l;
    }
    if (name_end == l) *beg = 0, *end = INT_MAX;
    return s + name_end;
}